

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O0

vector<Mirror,_std::allocator<Mirror>_> * __thiscall
Mems::get_mirror_cluster
          (vector<Mirror,_std::allocator<Mirror>_> *__return_storage_ptr__,Mems *this,
          Point_d *displayed_sample)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  pointer pMVar6;
  reference __x;
  ostream *poVar7;
  size_type sVar8;
  __type _Var9;
  __type _Var10;
  double sample_dis;
  double dis_y;
  double dis_x;
  __normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> local_30;
  iterator it;
  Point_d *displayed_sample_local;
  Mems *this_local;
  vector<Mirror,_std::allocator<Mirror>_> *m_cluster;
  
  it._M_current._7_1_ = 0;
  std::vector<Mirror,_std::allocator<Mirror>_>::vector(__return_storage_ptr__);
  local_30._M_current =
       (Mirror *)std::begin<std::vector<Mirror,std::allocator<Mirror>>>(&this->_mems_mirrors);
  while( true ) {
    dis_x = (double)std::end<std::vector<Mirror,std::allocator<Mirror>>>(&this->_mems_mirrors);
    bVar5 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_> *
                       )&dis_x);
    if (!bVar5) break;
    dVar1 = displayed_sample->x;
    pMVar6 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_30);
    dVar2 = (pMVar6->_position).x;
    dVar3 = displayed_sample->y;
    pMVar6 = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
             operator->(&local_30);
    dVar4 = (pMVar6->_position).y;
    _Var9 = std::pow<double,int>(dVar1 - dVar2,2);
    _Var10 = std::pow<double,int>(dVar3 - dVar4,2);
    if (_Var9 + _Var10 <= this->max_sample_dis) {
      __x = __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
            operator*(&local_30);
      std::vector<Mirror,_std::allocator<Mirror>_>::push_back(__return_storage_ptr__,__x);
    }
    __gnu_cxx::__normal_iterator<Mirror_*,_std::vector<Mirror,_std::allocator<Mirror>_>_>::
    operator++(&local_30,0);
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"created mirrorcluster for mirror with size: ");
  sVar8 = std::vector<Mirror,_std::allocator<Mirror>_>::size(__return_storage_ptr__);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar8);
  std::operator<<(poVar7,"\n");
  return __return_storage_ptr__;
}

Assistant:

std::vector<Mirror> Mems::get_mirror_cluster(Point_d const& displayed_sample){

  std::vector<Mirror> m_cluster;
  for(auto it = std::begin(_mems_mirrors); it != std::end(_mems_mirrors); it++)
    {
      double dis_x = displayed_sample.x - it->_position.x;
      double dis_y = displayed_sample.y - it->_position.y;
      double sample_dis = pow(dis_x , 2)+pow(dis_y , 2);
              if(sample_dis<=max_sample_dis)
                {
                  m_cluster.push_back(*it);
                }
    }
    std::cout<<"created mirrorcluster for mirror with size: "<< m_cluster.size()<< "\n";
    return m_cluster;
  }